

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O3

void __thiscall
TIFFImageHandler::WriteImageXObjectFilter
          (TIFFImageHandler *this,DictionaryContext *inImageDictionary,int inTileIndex)

{
  ushort uVar1;
  undefined2 uVar2;
  t2p_compress_t tVar3;
  int iVar4;
  long lVar5;
  DictionaryContext *this_00;
  T2P_TILES *pTVar6;
  ulong uVar7;
  
  if (this->mT2p->pdf_compression == T2P_COMPRESS_NONE) {
    return;
  }
  DictionaryContext::WriteKey(inImageDictionary,&scFilter_abi_cxx11_);
  tVar3 = this->mT2p->pdf_compression;
  if (tVar3 == T2P_COMPRESS_ZIP) {
    DictionaryContext::WriteNameValue(inImageDictionary,&scFlateDecode_abi_cxx11_);
    uVar2 = this->mT2p->pdf_compressionquality;
    if ((ushort)((ushort)(uVar2 * 0x5c29) >> 2 | uVar2 * 0x4000) < 0x290) {
      return;
    }
    DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
    this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
    DictionaryContext::WriteKey(this_00,&scPredictor_abi_cxx11_);
    uVar1 = this->mT2p->pdf_compressionquality;
    DictionaryContext::WriteIntegerValue
              (this_00,(ulong)((uint)uVar1 + ((uVar1 >> 2) / 0x19) * -100 & 0xffff));
    DictionaryContext::WriteKey(this_00,&scColumns_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_width);
    DictionaryContext::WriteKey(this_00,&scColors_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_samplesperpixel);
    DictionaryContext::WriteKey(this_00,&scBitsPerComponent_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_bitspersample);
  }
  else {
    if (tVar3 != T2P_COMPRESS_G4) {
      return;
    }
    DictionaryContext::WriteNameValue(inImageDictionary,&scCCITTFaxDecode_abi_cxx11_);
    DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
    this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
    DictionaryContext::WriteKey(this_00,&scK_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(this_00,-1);
    iVar4 = *(int *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28);
    DictionaryContext::WriteKey(this_00,&scColumns_abi_cxx11_);
    if (iVar4 == 0) {
      DictionaryContext::WriteIntegerValue(this_00,(ulong)this->mT2p->tiff_width);
      DictionaryContext::WriteKey(this_00,&scRows_abi_cxx11_);
      pTVar6 = (T2P_TILES *)&this->mT2p->tiff_length;
    }
    else {
      pTVar6 = this->mT2p->tiff_tiles;
      uVar7 = (ulong)this->mT2p->pdf_page;
      if (((inTileIndex + 1U) % *(uint *)(pTVar6 + uVar7 * 0x28 + 0xc) == 0) &&
         (*(int *)(pTVar6 + uVar7 * 0x28 + 0x14) != 0)) {
        lVar5 = uVar7 * 0x28 + 0x14;
      }
      else {
        lVar5 = uVar7 * 0x28 + 4;
      }
      DictionaryContext::WriteIntegerValue(this_00,(ulong)*(uint *)(pTVar6 + lVar5));
      DictionaryContext::WriteKey(this_00,&scRows_abi_cxx11_);
      pTVar6 = this->mT2p->tiff_tiles;
      uVar7 = (ulong)this->mT2p->pdf_page;
      if ((inTileIndex < *(int *)(pTVar6 + uVar7 * 0x28) - *(int *)(pTVar6 + uVar7 * 0x28 + 0xc)) ||
         (*(int *)(pTVar6 + uVar7 * 0x28 + 0x18) == 0)) {
        pTVar6 = pTVar6 + uVar7 * 0x28 + 8;
      }
      else {
        pTVar6 = pTVar6 + uVar7 * 0x28 + 0x18;
      }
    }
    DictionaryContext::WriteIntegerValue(this_00,(ulong)*(uint *)pTVar6);
    if (this->mT2p->pdf_switchdecode == 0) {
      DictionaryContext::WriteKey(this_00,&scBlackIs1_abi_cxx11_);
      DictionaryContext::WriteBooleanValue(this_00,true);
    }
  }
  ObjectsContext::EndDictionary(this->mObjectsContext,this_00);
  return;
}

Assistant:

void TIFFImageHandler::WriteImageXObjectFilter(DictionaryContext* inImageDictionary,int inTileIndex)
{
	DictionaryContext* decodeParmsDictionary;

	if(mT2p->pdf_compression==T2P_COMPRESS_NONE)
		return;

	// Filter
	inImageDictionary->WriteKey(scFilter);


	switch(mT2p->pdf_compression)
	{
		case T2P_COMPRESS_G4:
			inImageDictionary->WriteNameValue(scCCITTFaxDecode);

			// DecodeParms
			inImageDictionary->WriteKey(scDecodeParms);
			decodeParmsDictionary = mObjectsContext->StartDictionary();

			// K
			decodeParmsDictionary->WriteKey(scK);
			decodeParmsDictionary->WriteIntegerValue(-1);

			if(0 == mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilecount)
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_length);
			}
			else
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsRightEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilewidth :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilewidth
					);
			
				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsBottomEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilelength :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilelength
					);
			}

			if(mT2p->pdf_switchdecode == 0)
			{
				// BlackIs1
				decodeParmsDictionary->WriteKey(scBlackIs1);
				decodeParmsDictionary->WriteBooleanValue(true);
			}
			mObjectsContext->EndDictionary(decodeParmsDictionary);
			break;
		case T2P_COMPRESS_ZIP:
			inImageDictionary->WriteNameValue(scFlateDecode);

			if(mT2p->pdf_compressionquality%100)
			{
				// DecodeParms
				inImageDictionary->WriteKey(scDecodeParms);
				decodeParmsDictionary = mObjectsContext->StartDictionary();

				// Predictor
				decodeParmsDictionary->WriteKey(scPredictor);
				decodeParmsDictionary->WriteIntegerValue(mT2p->pdf_compressionquality%100);

				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Colors
				decodeParmsDictionary->WriteKey(scColors);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_samplesperpixel);

				// BitsPerComponent
				decodeParmsDictionary->WriteKey(scBitsPerComponent);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_bitspersample);

				mObjectsContext->EndDictionary(decodeParmsDictionary);
			}
			break;
        default:
            // do nothing
            break;
	}
}